

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O3

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  ushort uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  
  iVar5 = run_container_cardinality(container1);
  iVar2 = container2->cardinality;
  if (iVar2 < iVar5) {
LAB_0011b25d:
    _Var4 = false;
  }
  else {
    if (0 < (long)container1->n_runs) {
      puVar3 = container2->array;
      iVar5 = -1;
      lVar12 = 0;
      do {
        uVar1 = container1->runs[lVar12].value;
        uVar14 = (uint)container1->runs[lVar12].length;
        uVar9 = uVar1 + uVar14;
        iVar6 = iVar5 + 1;
        iVar7 = iVar6;
        iVar15 = iVar6;
        if (iVar6 < iVar2) {
          if (puVar3[iVar6] < uVar1) {
            iVar10 = iVar5 + 2;
            iVar13 = 1;
            if (iVar10 < iVar2) {
              iVar13 = 1;
              do {
                uVar8 = puVar3[iVar10];
                if (uVar1 <= uVar8) goto LAB_0011b2fe;
                iVar15 = iVar13 * 2;
                iVar10 = iVar6 + iVar13 * 2;
                iVar13 = iVar15;
              } while (iVar10 < iVar2);
            }
            uVar8 = puVar3[(long)iVar2 + -1];
            iVar10 = iVar2 + -1;
LAB_0011b2fe:
            iVar15 = iVar10;
            if (((uVar8 != uVar1) && (iVar15 = iVar2, uVar1 <= uVar8)) &&
               (iVar15 = iVar10, iVar6 + (iVar13 >> 1) + 1 != iVar10)) {
              iVar13 = (iVar13 >> 1) + iVar6;
              do {
                iVar15 = iVar10 + iVar13 >> 1;
                if (puVar3[iVar15] == uVar1) break;
                iVar16 = iVar15;
                if (puVar3[iVar15] < uVar1) {
                  iVar16 = iVar10;
                  iVar13 = iVar15;
                }
                iVar15 = iVar16;
                iVar10 = iVar16;
              } while (iVar13 + 1 != iVar16);
            }
          }
          uVar8 = (ushort)uVar9;
          if (puVar3[iVar6] < uVar8) {
            iVar5 = iVar5 + 2;
            iVar10 = 1;
            if (iVar5 < iVar2) {
              iVar10 = 1;
              do {
                uVar11 = puVar3[iVar5];
                if (uVar8 <= uVar11) goto LAB_0011b36b;
                iVar7 = iVar10 * 2;
                iVar5 = iVar6 + iVar10 * 2;
                iVar10 = iVar7;
              } while (iVar5 < iVar2);
            }
            uVar11 = puVar3[(long)iVar2 + -1];
            iVar5 = iVar2 + -1;
LAB_0011b36b:
            iVar7 = iVar5;
            if (uVar11 != uVar8) {
              if (uVar11 < uVar8) goto LAB_0011b25d;
              if ((iVar10 >> 1) + iVar6 + 1 != iVar5) {
                iVar6 = (iVar10 >> 1) + iVar6;
                do {
                  iVar7 = iVar6 + iVar5 >> 1;
                  if (puVar3[iVar7] == uVar8) break;
                  if (uVar8 <= puVar3[iVar7]) {
                    iVar5 = iVar7;
                    iVar7 = iVar6;
                  }
                  iVar6 = iVar7;
                  iVar7 = iVar5;
                } while (iVar6 + 1 != iVar5);
              }
            }
          }
        }
        iVar5 = iVar7;
        if (iVar5 == iVar2) {
          return false;
        }
        if (iVar5 - iVar15 != uVar14) {
          return false;
        }
        if ((puVar3[iVar15] != uVar1) || (uVar9 != puVar3[iVar5])) goto LAB_0011b25d;
        lVar12 = lVar12 + 1;
      } while (lVar12 != container1->n_runs);
    }
    _Var4 = true;
  }
  return _Var4;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (stop_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}